

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2.c
# Opt level: O2

MPP_RET get_param_from_env(iep2_api_ctx *ctx)

{
  MPP_RET MVar1;
  
  mpp_env_get_u32("md_theta",&(ctx->params).md_theta,(ctx->params).md_theta);
  mpp_env_get_u32("md_r",&(ctx->params).md_r,(ctx->params).md_r);
  mpp_env_get_u32("md_lambda",&(ctx->params).md_lambda,(ctx->params).md_lambda);
  mpp_env_get_u32("mv_similar_thr",&(ctx->params).mv_similar_thr,(ctx->params).mv_similar_thr);
  mpp_env_get_u32("mv_similar_num_thr0",&(ctx->params).mv_similar_num_thr0,
                  (ctx->params).mv_similar_num_thr0);
  mpp_env_get_u32("eedi_thr0",&(ctx->params).eedi_thr0,(ctx->params).eedi_thr0);
  mpp_env_get_u32("comb_t_thr",&(ctx->params).comb_t_thr,(ctx->params).comb_t_thr);
  MVar1 = mpp_env_get_u32("comb_feature_thr",&(ctx->params).comb_feature_thr,
                          (ctx->params).comb_feature_thr);
  return MVar1;
}

Assistant:

static MPP_RET get_param_from_env(struct iep2_api_ctx *ctx)
{
    struct iep2_params *params = &ctx->params;
    mpp_env_get_u32("md_theta", &params->md_theta, ctx->params.md_theta);
    mpp_env_get_u32("md_r", &params->md_r, ctx->params.md_r);
    mpp_env_get_u32("md_lambda", &params->md_lambda, ctx->params.md_lambda);

    mpp_env_get_u32("mv_similar_thr", &params->mv_similar_thr, ctx->params.mv_similar_thr);
    mpp_env_get_u32("mv_similar_num_thr0", &params->mv_similar_num_thr0, ctx->params.mv_similar_num_thr0);

    mpp_env_get_u32("eedi_thr0", &params->eedi_thr0, ctx->params.eedi_thr0);
    mpp_env_get_u32("comb_t_thr", &params->comb_t_thr, ctx->params.comb_t_thr);
    mpp_env_get_u32("comb_feature_thr", &params->comb_feature_thr, ctx->params.comb_feature_thr);
    return MPP_OK;
}